

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

float * ldr_to_hdr(stbi_uc *data,int x,int y,int comp)

{
  uint uVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  float *pfVar8;
  stbi_uc *psVar9;
  double dVar10;
  
  uVar6 = x * y;
  pfVar2 = (float *)malloc((long)(int)(uVar6 * comp) << 2);
  if (pfVar2 == (float *)0x0) {
    free(data);
    failure_reason = "Out of memory";
    pfVar2 = (float *)0x0;
  }
  else {
    if (0 < (int)uVar6) {
      uVar1 = ((comp & 1U) + comp) - 1;
      lVar4 = (long)comp;
      uVar7 = 0;
      pfVar8 = pfVar2;
      psVar9 = data;
      do {
        uVar5 = 0;
        if (0 < (int)uVar1) {
          uVar5 = 0;
          do {
            dVar10 = pow((double)((float)psVar9[uVar5] / 255.0),(double)l2h_gamma);
            pfVar8[uVar5] = (float)dVar10 * l2h_scale;
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
        }
        if ((int)uVar5 < comp) {
          lVar3 = (long)(int)uVar5 + uVar7 * lVar4;
          pfVar2[lVar3] = (float)data[lVar3] / 255.0;
        }
        uVar7 = uVar7 + 1;
        psVar9 = psVar9 + lVar4;
        pfVar8 = pfVar8 + lVar4;
      } while (uVar7 != uVar6);
    }
    free(data);
  }
  return pfVar2;
}

Assistant:

static float   *ldr_to_hdr(stbi_uc *data, int x, int y, int comp)
{
   int i,k,n;
   float *output = (float *) malloc(x * y * comp * sizeof(float));
   if (output == NULL) { free(data); return epf("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         output[i*comp + k] = (float) pow(data[i*comp+k]/255.0f, l2h_gamma) * l2h_scale;
      }
      if (k < comp) output[i*comp + k] = data[i*comp+k]/255.0f;
   }
   free(data);
   return output;
}